

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::
InitializeKeyValue<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (MapFieldBase *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          basic_string_view<char,_std::char_traits<char>_> *init)

{
  Arena *pAVar1;
  allocator<char> local_31;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  basic_string_view<char,_std::char_traits<char>_> *init_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  MapFieldBase *this_local;
  ThreadSafeArena *local_10;
  
  local_30 = init;
  init_local = (basic_string_view<char,_std::char_traits<char>_> *)v;
  v_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)v,init,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pAVar1 = arena(this);
  if (pAVar1 != (Arena *)0x0) {
    local_10 = &arena(this)->impl_;
    this_local = (MapFieldBase *)init_local;
    if (init_local != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      ThreadSafeArena::AddCleanup
                (local_10,init_local,cleanup::arena_destruct_object<std::__cxx11::string>);
    }
  }
  return;
}

Assistant:

void InitializeKeyValue(T* v, const U&... init) {
    ::new (static_cast<void*>(v)) T(init...);
    if constexpr (std::is_same_v<std::string, T>) {
      if (arena() != nullptr) {
        arena()->OwnDestructor(v);
      }
    }
  }